

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<trust_token_method_st_const*,bool,bool,int>::
IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>
          (IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>> *this)

{
  bool bVar1;
  __tuple_element_t<3UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>,_ParamIterator<bool>,_ParamIterator<int>_>_>
  *p_Var2;
  __tuple_element_t<3UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>,_ParamIterator<bool>,_ParamIterator<int>_>_>
  *p_Var3;
  __tuple_element_t<2UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>,_ParamIterator<bool>,_ParamIterator<int>_>_>
  *this_00;
  size_t NextI;
  bool last;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this_local;
  
  p_Var2 = std::
           get<3ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>>
                     ((tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
                       *)(this + 0x50));
  p_Var3 = std::
           get<3ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>>
                     ((tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
                       *)(this + 0x30));
  bVar1 = ParamIterator<int>::operator!=(p_Var2,p_Var3);
  if (!bVar1) {
    p_Var2 = std::
             get<3ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>>
                       ((tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
                         *)(this + 0x10));
    p_Var3 = std::
             get<3ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>>
                       ((tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
                         *)(this + 0x50));
    ParamIterator<int>::operator=(p_Var3,p_Var2);
    this_00 = std::
              get<2ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>>
                        ((tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
                          *)(this + 0x50));
    ParamIterator<bool>::operator++(this_00);
    AdvanceIfEnd<2ul>(this);
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }